

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midi_timidity.cpp
# Opt level: O1

int __thiscall TimidityPPMIDIDevice::Resume(TimidityPPMIDIDevice *this)

{
  SoundStream *pSVar1;
  bool bVar2;
  int iVar3;
  
  iVar3 = 0;
  if ((this->super_PseudoMIDIDevice).Started == false) {
    bVar2 = LaunchTimidity(this);
    iVar3 = 1;
    if (bVar2) {
      pSVar1 = (this->super_PseudoMIDIDevice).Stream;
      if ((pSVar1 != (SoundStream *)0x0) &&
         (iVar3 = (*pSVar1->_vptr_SoundStream[2])(timidity_mastervolume.Value,pSVar1,1),
         (char)iVar3 == '\0')) {
        return 1;
      }
      (this->super_PseudoMIDIDevice).Started = true;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int TimidityPPMIDIDevice::Resume()
{
	if (!Started)
	{
		if (LaunchTimidity())
		{
			// Assume success if not mixing with the sound system
			if (Stream == NULL || Stream->Play(true, timidity_mastervolume))
			{
				Started = true;
				return 0;
			}
		}
		return 1;
	}
	return 0;
}